

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void rotate(TCGContext_conflict2 *tcg_ctx,TCGv_i32 reg,TCGv_i32 shift,int left,int size)

{
  uintptr_t o_1;
  
  if (size == 0x10) {
    tcg_gen_deposit_i32_m68k(tcg_ctx,reg,reg,reg,0x10,0x10);
  }
  else if (size == 8) {
    tcg_gen_ext8u_i32_m68k(tcg_ctx,reg,reg);
    tcg_gen_muli_i32_m68k(tcg_ctx,reg,reg,0x1010101);
  }
  if (left == 0) {
    tcg_gen_rotr_i32_m68k(tcg_ctx,reg,reg,shift);
  }
  else {
    tcg_gen_rotl_i32_m68k(tcg_ctx,reg,reg,shift);
  }
  if (size == 0x10) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx,reg,reg);
  }
  else if (size == 8) {
    tcg_gen_ext8s_i32_m68k(tcg_ctx,reg,reg);
  }
  if (QREG_CC_N != reg) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)(reg + (long)&tcg_ctx->pool_cur));
  }
  if (QREG_CC_Z != reg) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (TCGArg)(reg + (long)&tcg_ctx->pool_cur));
  }
  if (left == 0) {
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,reg,0x1f);
  }
  else {
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,reg,1);
  }
  tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),0);
  return;
}

Assistant:

static void rotate(TCGContext *tcg_ctx, TCGv reg, TCGv shift, int left, int size)
{
    switch (size) {
    case 8:
        /* Replicate the 8-bit input so that a 32-bit rotate works.  */
        tcg_gen_ext8u_i32(tcg_ctx, reg, reg);
        tcg_gen_muli_i32(tcg_ctx, reg, reg, 0x01010101);
        goto do_long;
    case 16:
        /* Replicate the 16-bit input so that a 32-bit rotate works.  */
        tcg_gen_deposit_i32(tcg_ctx, reg, reg, reg, 16, 16);
        goto do_long;
    do_long:
    default:
        if (left) {
            tcg_gen_rotl_i32(tcg_ctx, reg, reg, shift);
        } else {
            tcg_gen_rotr_i32(tcg_ctx, reg, reg, shift);
        }
    }

    /* compute flags */

    switch (size) {
    case 8:
        tcg_gen_ext8s_i32(tcg_ctx, reg, reg);
        break;
    case 16:
        tcg_gen_ext16s_i32(tcg_ctx, reg, reg);
        break;
    default:
        break;
    }

    /* QREG_CC_X is not affected */

    tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, reg);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, reg);

    if (left) {
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, reg, 1);
    } else {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, 31);
    }

    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0); /* always cleared */
}